

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode ExpandedNodeId_decodeBinary(UA_ExpandedNodeId *dst,UA_DataType *_)

{
  byte bVar1;
  UA_StatusCode UVar2;
  UA_StatusCode UVar3;
  uint uVar4;
  
  UVar2 = 0x80070000;
  if (pos < end) {
    bVar1 = *pos;
    *pos = bVar1 & 0x3f;
    UVar2 = NodeId_decodeBinary(&dst->nodeId,_);
    if ((char)bVar1 < '\0') {
      (dst->nodeId).namespaceIndex = 0;
      UVar3 = Array_decodeBinary(&(dst->namespaceUri).data,&(dst->namespaceUri).length,UA_TYPES + 2)
      ;
      UVar2 = UVar2 | UVar3;
    }
    if ((bVar1 & 0x40) != 0) {
      uVar4 = 0x80070000;
      if (pos + 4 <= end) {
        dst->serverIndex = *(UA_UInt32 *)pos;
        uVar4 = 0;
        pos = pos + 4;
      }
      UVar2 = UVar2 | uVar4;
    }
  }
  return UVar2;
}

Assistant:

static UA_StatusCode
ExpandedNodeId_decodeBinary(UA_ExpandedNodeId *dst, const UA_DataType *_) {
    /* Decode the encoding mask */
    if(pos >= end)
        return UA_STATUSCODE_BADDECODINGERROR;
    UA_Byte encoding = *pos;

    /* Mask out the encoding byte on the stream to decode the NodeId only */
    *pos = encoding & (UA_Byte)~(UA_EXPANDEDNODEID_NAMESPACEURI_FLAG |
                                 UA_EXPANDEDNODEID_SERVERINDEX_FLAG);
    UA_StatusCode retval = NodeId_decodeBinary(&dst->nodeId, NULL);

    /* Decode the NamespaceUri */
    if(encoding & UA_EXPANDEDNODEID_NAMESPACEURI_FLAG) {
        dst->nodeId.namespaceIndex = 0;
        retval |= String_decodeBinary(&dst->namespaceUri, NULL);
    }

    /* Decode the ServerIndex */
    if(encoding & UA_EXPANDEDNODEID_SERVERINDEX_FLAG)
        retval |= UInt32_decodeBinary(&dst->serverIndex, NULL);
    return retval;
}